

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void down2_symeven(uint8_t *input,int length,uint8_t *output,int start_offset)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint8_t uVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  byte *pbVar14;
  
  uVar1 = ((length & 1U) + length) - 4;
  if ((int)uVar1 < 4) {
    iVar3 = start_offset + 1;
    for (uVar2 = (ulong)start_offset; (long)uVar2 < (long)length; uVar2 = uVar2 + 2) {
      uVar12 = uVar2 & 0xffffffff;
      iVar7 = 0x40;
      iVar13 = iVar3;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = uVar12;
        }
        iVar8 = length + -1;
        if (iVar13 < length + -1) {
          iVar8 = iVar13;
        }
        iVar7 = iVar7 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar11) *
                        ((uint)input[iVar8] + (uint)input[uVar10]);
        uVar12 = (ulong)((int)uVar12 - 1);
        iVar13 = iVar13 + 1;
      }
      iVar7 = iVar7 >> 7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      *output = uVar6;
      output = output + 1;
      iVar3 = iVar3 + 2;
    }
  }
  else {
    uVar2 = (ulong)start_offset;
    pbVar4 = input + uVar2;
    iVar3 = start_offset + 1;
    pbVar5 = input + uVar2 + 1;
    for (; (long)uVar2 < 4; uVar2 = uVar2 + 2) {
      uVar12 = uVar2 & 0xffffffff;
      iVar13 = 0x40;
      pbVar9 = pbVar5;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = uVar12;
        }
        iVar13 = iVar13 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar11) *
                          ((uint)*pbVar9 + (uint)input[uVar10]);
        pbVar9 = pbVar9 + 1;
        uVar12 = (ulong)((int)uVar12 - 1);
      }
      iVar13 = iVar13 >> 7;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      uVar6 = (uint8_t)iVar13;
      if (0xfe < iVar13) {
        uVar6 = 0xff;
      }
      *output = uVar6;
      output = output + 1;
      pbVar4 = pbVar4 + 2;
      iVar3 = iVar3 + 2;
      pbVar5 = pbVar5 + 2;
    }
    for (; (long)uVar2 < (long)(ulong)uVar1; uVar2 = uVar2 + 2) {
      iVar13 = 0x40;
      pbVar9 = pbVar4;
      pbVar14 = pbVar5;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 2) {
        iVar13 = iVar13 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar11) *
                          ((uint)*pbVar14 + (uint)*pbVar9);
        pbVar14 = pbVar14 + 1;
        pbVar9 = pbVar9 + -1;
      }
      iVar7 = iVar13 >> 7;
      if (iVar13 >> 7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      *output = uVar6;
      output = output + 1;
      pbVar4 = pbVar4 + 2;
      iVar3 = iVar3 + 2;
      pbVar5 = pbVar5 + 2;
    }
    for (; (long)uVar2 < (long)length; uVar2 = uVar2 + 2) {
      iVar7 = 0x40;
      pbVar5 = pbVar4;
      iVar13 = iVar3;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 2) {
        iVar8 = length + -1;
        if (iVar13 < length + -1) {
          iVar8 = iVar13;
        }
        iVar7 = iVar7 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar11) *
                        ((uint)input[iVar8] + (uint)*pbVar5);
        pbVar5 = pbVar5 + -1;
        iVar13 = iVar13 + 1;
      }
      iVar7 = iVar7 >> 7;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      *output = uVar6;
      output = output + 1;
      pbVar4 = pbVar4 + 2;
      iVar3 = iVar3 + 2;
    }
  }
  return;
}

Assistant:

void down2_symeven(const uint8_t *const input, int length, uint8_t *output,
                   int start_offset) {
  // Actual filter len = 2 * filter_len_half.
  const int16_t *filter = av1_down2_symeven_half_filter;
  const int filter_len_half = sizeof(av1_down2_symeven_half_filter) / 2;
  int i, j;
  uint8_t *optr = output;
  int l1 = filter_len_half;
  int l2 = (length - filter_len_half);
  l1 += (l1 & 1);
  l2 += (l2 & 1);
  if (l1 > l2) {
    // Short input length.
    for (i = start_offset; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[AOMMAX(i - j, 0)] + input[AOMMIN(i + 1 + j, length - 1)]) *
            filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  } else {
    // Initial part.
    for (i = start_offset; i < l1; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[AOMMAX(i - j, 0)] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // Middle part.
    for (; i < l2; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum += (input[i - j] + input[i + 1 + j]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
    // End part.
    for (; i < length; i += 2) {
      int sum = (1 << (FILTER_BITS - 1));
      for (j = 0; j < filter_len_half; ++j) {
        sum +=
            (input[i - j] + input[AOMMIN(i + 1 + j, length - 1)]) * filter[j];
      }
      sum >>= FILTER_BITS;
      *optr++ = clip_pixel(sum);
    }
  }
}